

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O2

void soplex::
     initConstVecs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vecset,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *facset,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *veclogs,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *vecnnzinv,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *epsilon)

{
  Item *pIVar1;
  undefined8 *puVar2;
  uint *puVar3;
  undefined1 uVar4;
  uint uVar5;
  int iVar6;
  fpclass_type fVar7;
  int32_t iVar8;
  Item *pIVar9;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar10;
  double dVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this;
  ulong uVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  ulong uVar16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nnzinv;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  logsum;
  int local_2d4;
  double local_290;
  cpp_dec_float<50U,_int,_void> local_288;
  cpp_dec_float<50U,_int,_void> local_250;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  int local_1c0;
  undefined1 local_1bc;
  fpclass_type local_1b8;
  int32_t local_1b4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  uVar5 = (vecset->set).thenum;
  uVar15 = 0;
  uVar13 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar13 = uVar15;
  }
  for (; uVar15 != uVar13; uVar15 = uVar15 + 1) {
    uVar16 = 0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_250,0.0,(type *)0x0);
    pIVar9 = (vecset->set).theitem;
    iVar6 = (vecset->set).thekey[uVar15].idx;
    pIVar1 = pIVar9 + iVar6;
    uVar5 = pIVar9[iVar6].data.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused;
    uVar14 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar14 = uVar16;
    }
    local_2d4 = 0;
    for (; uVar14 * 0x3c != uVar16; uVar16 = uVar16 + 0x3c) {
      pNVar10 = (pIVar1->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      local_1f8 = *(undefined8 *)((long)&(pNVar10->val).m_backend.data + uVar16 + 0x20);
      puVar2 = (undefined8 *)((long)&(pNVar10->val).m_backend.data + uVar16);
      local_218 = *puVar2;
      uStack_210 = puVar2[1];
      puVar2 = (undefined8 *)((long)&(pNVar10->val).m_backend.data + uVar16 + 0x10);
      local_208 = *puVar2;
      uStack_200 = puVar2[1];
      iVar6 = *(int *)((long)&(pNVar10->val).m_backend.data + uVar16 + 0x28);
      uVar4 = *(undefined1 *)((long)&(pNVar10->val).m_backend.data + uVar16 + 0x2c);
      fVar7 = *(fpclass_type *)((long)&(pNVar10->val).m_backend.data + uVar16 + 0x30);
      iVar8 = *(int32_t *)((long)&(pNVar10->val).m_backend.data + uVar16 + 0x34);
      puVar3 = (uint *)((long)&(pNVar10->val).m_backend.data + uVar16);
      local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar3;
      local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 2);
      puVar3 = (uint *)((long)&(pNVar10->val).m_backend.data + uVar16 + 0x10);
      local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
      local_1a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pNVar10->val).m_backend.data + uVar16 + 0x20);
      local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
      local_68.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
      local_68.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
      local_68.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
      local_68.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
      local_68.m_backend.exp = (epsilon->m_backend).exp;
      local_68.m_backend.neg = (epsilon->m_backend).neg;
      local_68.m_backend.fpclass = (epsilon->m_backend).fpclass;
      local_68.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
      local_1a8.m_backend.exp = iVar6;
      local_1a8.m_backend.neg = (bool)uVar4;
      local_1a8.m_backend.fpclass = fVar7;
      local_1a8.m_backend.prec_elem = iVar8;
      bVar12 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_1a8,&local_68);
      if (!bVar12) {
        local_1e8 = local_218;
        uStack_1e0 = uStack_210;
        local_1d8 = local_208;
        uStack_1d0 = uStack_200;
        local_1c8 = local_1f8;
        local_1c0 = iVar6;
        local_1bc = uVar4;
        local_1b8 = fVar7;
        local_1b4 = iVar8;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&local_288,(multiprecision *)&local_1e8,arg);
        dVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                           (&local_288);
        local_290 = log2(dVar11);
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                  (&local_250,&local_290);
        local_2d4 = local_2d4 + 1;
      }
    }
    local_288.fpclass = cpp_dec_float_finite;
    local_288.prec_elem = 10;
    local_288.data._M_elems[0] = 0;
    local_288.data._M_elems[1] = 0;
    local_288.data._M_elems[2] = 0;
    local_288.data._M_elems[3] = 0;
    local_288.data._M_elems[4] = 0;
    local_288.data._M_elems[5] = 0;
    local_288.data._M_elems._24_5_ = 0;
    local_288.data._M_elems[7]._1_3_ = 0;
    local_288.data._M_elems._32_5_ = 0;
    local_288.data._M_elems[9]._1_3_ = 0;
    local_288.exp = 0;
    local_288.neg = false;
    if (local_2d4 < 1) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_250,1.0);
      dVar11 = 1.0;
    }
    else {
      dVar11 = 1.0 / (double)local_2d4;
    }
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_288,dVar11);
    local_a8.m_backend.data._M_elems[0] = local_250.data._M_elems[0];
    local_a8.m_backend.data._M_elems[1] = local_250.data._M_elems[1];
    local_a8.m_backend.data._M_elems[2] = local_250.data._M_elems[2];
    local_a8.m_backend.data._M_elems[3] = local_250.data._M_elems[3];
    local_a8.m_backend.data._M_elems[4] = local_250.data._M_elems[4];
    local_a8.m_backend.data._M_elems[5] = local_250.data._M_elems[5];
    local_a8.m_backend.data._M_elems[6] = local_250.data._M_elems[6];
    local_a8.m_backend.data._M_elems[7] = local_250.data._M_elems[7];
    local_a8.m_backend.data._M_elems[8] = local_250.data._M_elems[8];
    local_a8.m_backend.data._M_elems[9] = local_250.data._M_elems[9];
    local_a8.m_backend.exp = local_250.exp;
    local_a8.m_backend.neg = local_250.neg;
    local_a8.m_backend.fpclass = local_250.fpclass;
    local_a8.m_backend.prec_elem = local_250.prec_elem;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(veclogs,(int)uVar15,&local_a8);
    local_e8.m_backend.data._M_elems[9]._1_3_ = local_288.data._M_elems[9]._1_3_;
    local_e8.m_backend.data._M_elems._32_5_ = local_288.data._M_elems._32_5_;
    local_e8.m_backend.data._M_elems[7]._1_3_ = local_288.data._M_elems[7]._1_3_;
    local_e8.m_backend.data._M_elems._24_5_ = local_288.data._M_elems._24_5_;
    local_e8.m_backend.data._M_elems[4] = local_288.data._M_elems[4];
    local_e8.m_backend.data._M_elems[5] = local_288.data._M_elems[5];
    local_e8.m_backend.data._M_elems[0] = local_288.data._M_elems[0];
    local_e8.m_backend.data._M_elems[1] = local_288.data._M_elems[1];
    local_e8.m_backend.data._M_elems[2] = local_288.data._M_elems[2];
    local_e8.m_backend.data._M_elems[3] = local_288.data._M_elems[3];
    local_e8.m_backend.exp = local_288.exp;
    local_e8.m_backend.neg = local_288.neg;
    local_e8.m_backend.fpclass = local_288.fpclass;
    local_e8.m_backend.prec_elem = local_288.prec_elem;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(vecnnzinv,(int)uVar15,&local_e8);
    this = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::create(facset,local_2d4);
    for (uVar16 = 0; uVar14 * 0x3c != uVar16; uVar16 = uVar16 + 0x3c) {
      pNVar10 = (pIVar1->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      local_128.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pNVar10->val).m_backend.data + uVar16 + 0x20);
      puVar3 = (uint *)((long)&(pNVar10->val).m_backend.data + uVar16);
      local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar3;
      local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 2);
      puVar3 = (uint *)((long)&(pNVar10->val).m_backend.data + uVar16 + 0x10);
      local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
      local_128.m_backend.exp = *(int *)((long)&(pNVar10->val).m_backend.data + uVar16 + 0x28);
      local_128.m_backend.neg = *(bool *)((long)&(pNVar10->val).m_backend.data + uVar16 + 0x2c);
      local_128.m_backend._48_8_ =
           *(undefined8 *)((long)&(pNVar10->val).m_backend.data + uVar16 + 0x30);
      local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
      local_168.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
      local_168.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
      local_168.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
      local_168.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
      local_168.m_backend.exp = (epsilon->m_backend).exp;
      local_168.m_backend.neg = (epsilon->m_backend).neg;
      local_168.m_backend.fpclass = (epsilon->m_backend).fpclass;
      local_168.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
      bVar12 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_128,&local_168);
      if (!bVar12) {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(this,*(int *)((long)(&((pIVar1->data).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + uVar16),
              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_288);
      }
    }
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::sort(this);
  }
  return;
}

Assistant:

static void initConstVecs(
   const SVSetBase<R>* vecset,
   SVSetBase<R>& facset,
   SSVectorBase<R>& veclogs,
   SSVectorBase<R>& vecnnzinv,
   R epsilon)
{
   assert(vecset != nullptr);

   const int nvec = vecset->num();

   for(int k = 0; k < nvec; ++k)
   {
      R logsum = 0.0;
      int nnz = 0;
      // get kth row or column of LP
      const SVectorBase<R>& lpvec = (*vecset)[k];
      const int size = lpvec.size();

      for(int i = 0; i < size; ++i)
      {
         const R a = lpvec.value(i);

         if(!isZero(a, epsilon))
         {
            logsum += log2(double(spxAbs(a))); // todo spxLog2?
            nnz++;
         }
      }

      R nnzinv;

      if(nnz > 0)
      {
         nnzinv = 1.0 / nnz;
      }
      else
      {
         /* all-0 entries */
         logsum = 1.0;
         nnzinv = 1.0;
      }

      veclogs.add(k, logsum);
      vecnnzinv.add(k, nnzinv);

      /* create new VectorBase<R> for facset */
      SVectorBase<R>& vecnew = (*(facset.create(nnz)));

      for(int i = 0; i < size; ++i)
      {
         if(!isZero(lpvec.value(i), epsilon))
            vecnew.add(lpvec.index(i), nnzinv);
      }

      vecnew.sort();
   }

   assert(veclogs.isSetup());
   assert(vecnnzinv.isSetup());
}